

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void deqp::gles2::Functional::checkColorFormatSupport(Context *context,deUint32 sizedFormat)

{
  bool bVar1;
  NotSupportedError *this;
  allocator<char> local_39;
  string local_38;
  deUint32 local_14;
  Context *pCStack_10;
  deUint32 sizedFormat_local;
  Context *context_local;
  
  if ((((sizedFormat == 0x822d) || (sizedFormat == 0x822f)) ||
      (sizedFormat == 0x881a || sizedFormat == 0x881b)) &&
     (local_14 = sizedFormat, pCStack_10 = context,
     bVar1 = isExtensionSupported(context,"GL_EXT_color_buffer_half_float"), !bVar1)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_color_buffer_half_float is not supported",&local_39);
    tcu::NotSupportedError::NotSupportedError(this,&local_38);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  return;
}

Assistant:

static void checkColorFormatSupport (sglr::Context& context, deUint32 sizedFormat)
{
	switch (sizedFormat)
	{
		case GL_RGBA16F:
		case GL_RGB16F:
		case GL_RG16F:
		case GL_R16F:
			if (!isExtensionSupported(context, "GL_EXT_color_buffer_half_float"))
				throw tcu::NotSupportedError("GL_EXT_color_buffer_half_float is not supported");

		default:
			break;
	}
}